

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallmon.cpp
# Opt level: O0

void __thiscall wallmon::wallmon(wallmon *this)

{
  initializer_list<prmon::parameter> __l;
  bool bVar1;
  Imonitor *in_RDI;
  parameter *param;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_list *__range1;
  parameter *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  parameter *in_stack_fffffffffffffcf8;
  monitored_value *in_stack_fffffffffffffd00;
  parameter *in_stack_fffffffffffffd08;
  parameter *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  string *in_stack_fffffffffffffd20;
  iterator in_stack_fffffffffffffd28;
  parameter *in_stack_fffffffffffffd30;
  undefined8 **local_2a8;
  level_enum *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  MessageBase *in_stack_fffffffffffffe30;
  string local_170 [32];
  reference local_150;
  parameter *local_148;
  __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
  local_140;
  Imonitor *local_138;
  allocator local_129;
  string local_128 [38];
  undefined1 local_102;
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [55];
  allocator local_a1;
  string local_a0 [32];
  undefined1 **local_80;
  undefined8 *local_78 [12];
  undefined1 **local_18;
  undefined8 local_10;
  
  Imonitor::Imonitor(in_RDI);
  MessageBase::MessageBase((MessageBase *)0x357145);
  in_RDI->_vptr_Imonitor = (_func_int **)&PTR__wallmon_003c38b0;
  local_102 = 1;
  local_80 = (undefined1 **)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"wtime",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"s",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"",&local_101);
  prmon::parameter::parameter
            (in_stack_fffffffffffffd30,&in_stack_fffffffffffffd28->m_name,in_stack_fffffffffffffd20,
             (string *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  local_102 = 0;
  local_18 = (undefined1 **)local_78;
  local_10 = 1;
  std::allocator<prmon::parameter>::allocator((allocator<prmon::parameter> *)0x357271);
  __l._M_len = (size_type)in_stack_fffffffffffffd30;
  __l._M_array = in_stack_fffffffffffffd28;
  std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::vector
            ((vector<prmon::parameter,_std::allocator<prmon::parameter>_> *)
             in_stack_fffffffffffffd20,__l,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  std::allocator<prmon::parameter>::~allocator((allocator<prmon::parameter> *)0x3572a2);
  local_2a8 = &local_18;
  do {
    local_2a8 = local_2a8 + -0xc;
    prmon::parameter::~parameter
              ((parameter *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
  } while (local_2a8 != local_78);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
         *)0x357343);
  *(undefined1 *)&in_RDI[0xd]._vptr_Imonitor = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"wallmon",&local_129);
  MessageBase::log_init
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  local_138 = in_RDI + 4;
  local_140._M_current =
       (parameter *)
       std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::begin
                 (in_stack_fffffffffffffce8);
  local_148 = (parameter *)
              std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::end
                        ((vector<prmon::parameter,_std::allocator<prmon::parameter>_> *)
                         in_stack_fffffffffffffce8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                        *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                       (__normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                        *)in_stack_fffffffffffffce8);
    if (!bVar1) break;
    local_150 = __gnu_cxx::
                __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                ::operator*(&local_140);
    prmon::parameter::get_name_abi_cxx11_(in_stack_fffffffffffffce8);
    prmon::parameter::parameter(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    prmon::monitored_value::monitored_value
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,(bool)in_stack_fffffffffffffcf7,
               (mon_value)in_stack_fffffffffffffce8);
    std::
    map<std::__cxx11::string,prmon::monitored_value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
    ::emplace<std::__cxx11::string_const,prmon::monitored_value>
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
                *)in_stack_fffffffffffffd00,&in_stack_fffffffffffffcf8->m_name,
               (monitored_value *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    prmon::monitored_value::~monitored_value((monitored_value *)0x3574d7);
    prmon::parameter::~parameter
              ((parameter *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    std::__cxx11::string::~string(local_170);
    __gnu_cxx::
    __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
    ::operator++(&local_140);
  }
  return;
}

Assistant:

wallmon::wallmon() : got_mother_starttime{false} {
  log_init(MONITOR_NAME);
#undef MONITOR_NAME
  for (const auto& param : params) {
    walltime_stats.emplace(param.get_name(),
                           prmon::monitored_value(param, true));
  }
}